

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aistr.cpp
# Opt level: O2

void __thiscall Test_aistr_length_static_Test::TestBody(Test_aistr_length_static_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_38;
  AssertHelper local_30;
  AssertionResult gtest_ar;
  char buf [10];
  
  buf[8] = '\0';
  buf[9] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  local_38.data_ = (AssertHelperData *)ai::length<10ul>(&buf);
  local_30.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"ai::length(buf)","0",(unsigned_long *)&local_38,(int *)&local_30
            );
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    builtin_strncpy(buf,"1234",5);
    local_38.data_ = (AssertHelperData *)ai::length<10ul>(&buf);
    local_30.data_._0_4_ = 4;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&gtest_ar,"ai::length(buf)","4",(unsigned_long *)&local_38,
               (int *)&local_30);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_38);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                 ,0x35,pcVar2);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      builtin_strncpy(buf,"123456789",10);
      local_38.data_ = (AssertHelperData *)ai::length<10ul>(&buf);
      local_30.data_._0_4_ = 9;
      testing::internal::CmpHelperEQ<unsigned_long,int>
                ((internal *)&gtest_ar,"ai::length(buf)","9",(unsigned_long *)&local_38,
                 (int *)&local_30);
      if (gtest_ar.success_ != false) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        buf[9] = '0';
        bVar1 = testing::internal::AlwaysTrue();
        if (bVar1) {
          ai::length<10ul>(&buf);
        }
        testing::Message::Message((Message *)&gtest_ar);
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                   ,0x3c,
                   "Expected: ai::length(buf) throws an exception of type std::out_of_range.\n  Actual: it throws nothing."
                  );
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar);
        buf._8_2_ = buf._8_2_ & 0xff;
        local_38.data_ = (AssertHelperData *)ai::length<10ul>(&buf);
        local_30.data_._0_4_ = 9;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)&gtest_ar,"ai::length(buf)","9",(unsigned_long *)&local_38,
                   (int *)&local_30);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_38);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_30,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                     ,0x3f,pcVar2);
          testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
          testing::internal::AssertHelper::~AssertHelper(&local_30);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_38);
        }
        goto LAB_0010d73a;
      }
      testing::Message::Message((Message *)&local_38);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                 ,0x37,pcVar2);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_38);
LAB_0010d73a:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(Test_aistr, length_static) {
    char buf[10] = {0};
    ASSERT_EQ(ai::length(buf), 0);

#ifdef _MSC_VER
    strcpy_s(buf, "1234");
    ASSERT_EQ(ai::length(buf), 4);
    strcpy_s(buf, "123456789");
    ASSERT_EQ(ai::length(buf), 9);
#else
    strcpy(buf, "1234");
    ASSERT_EQ(ai::length(buf), 4);
    strcpy(buf, "123456789");
    ASSERT_EQ(ai::length(buf), 9);
#endif

    // make buffer without last null-terminated char
    buf[9] = '0';
    EXPECT_THROW(ai::length(buf), std::out_of_range);

    buf[9] = '\0';
    ASSERT_EQ(ai::length(buf), 9);
}